

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall spdlog::details::scoped_padder::~scoped_padder(scoped_padder *this)

{
  size_t sVar1;
  long *in_RDI;
  scoped_padder *unaff_retaddr;
  long new_size;
  
  if (in_RDI[2] < 0) {
    if ((*(byte *)(*in_RDI + 0xc) & 1) != 0) {
      sVar1 = fmt::v6::internal::buffer<char>::size((buffer<char> *)in_RDI[1]);
      fmt::v6::internal::buffer<char>::resize((buffer<char> *)(sVar1 + in_RDI[2]),(size_t)in_RDI);
    }
  }
  else {
    pad_it(unaff_retaddr,(long)in_RDI);
  }
  return;
}

Assistant:

~scoped_padder()
    {
        if (remaining_pad_ >= 0)
        {
            pad_it(remaining_pad_);
        }
        else if (padinfo_.truncate_)
        {
            long new_size = static_cast<long>(dest_.size()) + remaining_pad_;
            dest_.resize(static_cast<size_t>(new_size));
        }
    }